

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_event_list.c
# Opt level: O3

EventListHandle EventListCreate(EventHandler event_handler,uint stack_size)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = calloc(1,0x80);
  if (pvVar2 == (void *)0x0) {
    iVar1 = LogLevelValid(0);
    if (iVar1 != 0) {
      LogWrite(0,"event_list","EventListCreate",0xcd,"malloc failed !");
    }
  }
  else {
    *(void **)pvVar2 = pvVar2;
    *(void **)((long)pvVar2 + 8) = pvVar2;
    *(long *)((long)pvVar2 + 0x10) = (long)pvVar2 + 0x10;
    *(long *)((long)pvVar2 + 0x18) = (long)pvVar2 + 0x10;
    *(long *)((long)pvVar2 + 0x20) = (long)pvVar2 + 0x20;
    *(long *)((long)pvVar2 + 0x28) = (long)pvVar2 + 0x20;
    *(EventHandler *)((long)pvVar2 + 0x40) = event_handler;
    *(code **)((long)pvVar2 + 0x48) = _highest_interruptable_handler;
    *(code **)((long)pvVar2 + 0x50) = _medium_interruptable_handler;
    *(code **)((long)pvVar2 + 0x58) = _lowest_interruptable_handler;
    uni_sem_new((long)pvVar2 + 0x68,0);
    uni_sem_new((long)pvVar2 + 0x70,0);
    uni_mutex_new((long)pvVar2 + 0x60);
    *(undefined4 *)((long)pvVar2 + 0x78) = 1;
    iVar1 = uni_thread_new("event_list",_event_handler,pvVar2,stack_size);
    if (iVar1 != 0) {
      __assert_fail("ret == OK",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/junlon2006[P]voice_iot_sdk/utils/event_list/src/uni_event_list.c"
                    ,199,"void _worker_thread_create(EventList *, unsigned int)");
    }
  }
  return pvVar2;
}

Assistant:

EventListHandle EventListCreate(EventHandler event_handler, unsigned int stack_size) {
  EventList *event_list;
  if (NULL == (event_list = (EventList *)uni_malloc(sizeof(EventList)))) {
    LOGE(TAG, "malloc failed !");
    return NULL;
  }

  _mzero_event_list(event_list);
  _list_init(event_list);
  _register_event_handler(event_list, event_handler);
  _register_interuppt_handler(event_list);
  _worker_thread_create(event_list, stack_size);
  return event_list;
}